

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> * __thiscall
cmLocalGenerator::AddUnityFilesModeAuto
          (vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,string *lang,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                   *filtered_sources,cmValue beforeInclude,cmValue afterInclude,
          string *filename_base,size_t batchSize)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pUVar4;
  int iVar5;
  ulong uVar6;
  unsigned_long val;
  long lVar7;
  ulong uVar8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
  sources;
  string filename;
  string local_f8;
  long local_d8;
  cmLocalGenerator *local_d0;
  cmGeneratorTarget *local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c0;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  *local_b8;
  string *local_b0;
  ulong local_a8;
  UnitySource local_a0;
  char *pcStack_78;
  long local_70;
  char *local_68;
  cmAlphaNum local_60;
  
  uVar6 = (long)(filtered_sources->
                super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(filtered_sources->
                super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (batchSize != 0) {
    uVar6 = batchSize;
  }
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar7 = (long)(filtered_sources->
                super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(filtered_sources->
                super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    local_a8 = lVar7 >> 5;
    local_d8 = uVar6 << 5;
    lVar7 = 0;
    val = 0;
    local_d0 = this;
    local_c8 = target;
    local_c0 = configs;
    local_b8 = filtered_sources;
    local_b0 = lang;
    do {
      uVar8 = local_a8;
      if (uVar6 < local_a8) {
        uVar8 = uVar6;
      }
      pcVar2 = (filename_base->_M_dataplus)._M_p;
      pcVar3 = (pointer)filename_base->_M_string_length;
      iVar5 = std::__cxx11::string::compare((char *)local_b0);
      local_a0.Path.field_2._M_allocated_capacity = 6;
      local_a0.Path.field_2._8_8_ = (long)" unity_" + 1;
      local_a0.Path._M_dataplus._M_p = pcVar3;
      local_a0.Path._M_string_length = (size_type)pcVar2;
      cmAlphaNum::cmAlphaNum(&local_60,val);
      local_68 = "_cxx.cxx";
      if (iVar5 == 0) {
        local_68 = "_c.c";
      }
      local_a0._32_8_ = local_60.View_._M_len;
      pcStack_78 = local_60.View_._M_str;
      local_70 = (ulong)(iVar5 != 0) * 4 + 4;
      views._M_len = 4;
      views._M_array = (iterator)&local_a0;
      cmCatViews_abi_cxx11_(&filename,views);
      pUVar4 = (local_b8->
               super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
               )._M_impl.super__Vector_impl_data._M_start;
      paVar1 = &filename.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p == paVar1) {
        local_f8.field_2._8_8_ = filename.field_2._8_8_;
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      }
      else {
        local_f8._M_dataplus._M_p = filename._M_dataplus._M_p;
      }
      local_f8.field_2._M_allocated_capacity._1_7_ = filename.field_2._M_allocated_capacity._1_7_;
      local_f8.field_2._M_local_buf[0] = filename.field_2._M_local_buf[0];
      sources.End._M_current = (UnityBatchedSource *)((long)&pUVar4[uVar8].Source + lVar7);
      local_f8._M_string_length = filename._M_string_length;
      filename._M_string_length = 0;
      filename.field_2._M_local_buf[0] = '\0';
      sources.Begin._M_current = (UnityBatchedSource *)((long)&pUVar4->Source + lVar7);
      filename._M_dataplus._M_p = (pointer)paVar1;
      WriteUnitySource(&local_a0,local_d0,local_c8,local_c0,sources,beforeInclude,afterInclude,
                       &local_f8);
      std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
      emplace_back<cmLocalGenerator::UnitySource>(__return_storage_ptr__,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.Path._M_dataplus._M_p != &local_a0.Path.field_2) {
        operator_delete(local_a0.Path._M_dataplus._M_p,
                        local_a0.Path.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p != paVar1) {
        operator_delete(filename._M_dataplus._M_p,
                        CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                                 filename.field_2._M_local_buf[0]) + 1);
      }
      val = val + 1;
      lVar7 = lVar7 + local_d8;
      local_a8 = local_a8 - uVar8;
    } while (local_a8 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmLocalGenerator::UnitySource>
cmLocalGenerator::AddUnityFilesModeAuto(
  cmGeneratorTarget* target, std::string const& lang,
  std::vector<std::string> const& configs,
  std::vector<UnityBatchedSource> const& filtered_sources,
  cmValue beforeInclude, cmValue afterInclude,
  std::string const& filename_base, size_t batchSize)
{
  if (batchSize == 0) {
    batchSize = filtered_sources.size();
  }

  std::vector<UnitySource> unity_files;
  for (size_t itemsLeft = filtered_sources.size(), chunk, batch = 0;
       itemsLeft > 0; itemsLeft -= chunk, ++batch) {

    chunk = std::min(itemsLeft, batchSize);

    std::string filename = cmStrCat(filename_base, "unity_", batch,
                                    (lang == "C") ? "_c.c" : "_cxx.cxx");
    auto const begin = filtered_sources.begin() + batch * batchSize;
    auto const end = begin + chunk;
    unity_files.emplace_back(this->WriteUnitySource(
      target, configs, cmMakeRange(begin, end), beforeInclude, afterInclude,
      std::move(filename)));
  }
  return unity_files;
}